

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,VirtualInterfaceType *type,string_view param_2)

{
  InstanceBodySymbol *pIVar1;
  bool bVar2;
  pointer pFVar3;
  Definition *pDVar4;
  size_t sVar5;
  TypeParameterSymbol *pTVar6;
  Type *type_00;
  ParameterSymbol *this_00;
  ConstantValue *this_01;
  string_view sVar7;
  basic_string_view<char> local_158;
  string_view local_148;
  string_view local_138 [2];
  SourceRange local_118;
  string local_108;
  string_view local_e8;
  basic_string_view<char> local_d8;
  ParameterSymbolBase *local_c8;
  ParameterSymbolBase *param;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *__range3;
  undefined1 local_98 [8];
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> params;
  VirtualInterfaceType *type_local;
  TypePrinter *this_local;
  string_view param_2_local;
  
  pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
           operator->(&this->buffer);
  pDVar4 = InstanceSymbol::getDefinition(type->iface);
  params.size_ = (pDVar4->name)._M_len;
  sVar7._M_len = (pDVar4->name)._M_len;
  sVar7._M_str = (pDVar4->name)._M_str;
  FormatBuffer::append(pFVar3,sVar7);
  pIVar1 = type->iface->body;
  local_98 = (undefined1  [8])(pIVar1->parameters).data_;
  params.data_ = (pointer)(pIVar1->parameters).size_;
  bVar2 = nonstd::span_lite::
          span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *)
                     local_98);
  if (!bVar2) {
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"#(");
    FormatBuffer::append(pFVar3,___range3);
    __begin3 = (iterator)local_98;
    __end3 = nonstd::span_lite::
             span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>
                         *)__begin3);
    param = (ParameterSymbolBase *)
            nonstd::span_lite::
            span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::end
                      ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *
                       )__begin3);
    for (; (ParameterSymbolBase *)__end3 != param; __end3 = __end3 + 1) {
      local_c8 = *__end3;
      pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      sVar5 = std::char_traits<char>::length("{}=");
      local_d8.size_ = sVar5;
      FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
                (pFVar3,(format_string<const_std::basic_string_view<char>_&>)local_d8,
                 &local_c8->symbol->name);
      if (local_c8->symbol->kind == TypeParameter) {
        pTVar6 = Symbol::as<slang::ast::TypeParameterSymbol>(local_c8->symbol);
        type_00 = DeclaredType::getType(&pTVar6->targetType);
        append(this,type_00);
      }
      else {
        pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
                 operator->(&this->buffer);
        this_00 = Symbol::as<slang::ast::ParameterSymbol>(local_c8->symbol);
        SourceRange::SourceRange(&local_118);
        this_01 = ParameterSymbol::getValue(this_00,local_118);
        slang::ConstantValue::toString_abi_cxx11_(&local_108,this_01);
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_108);
        local_e8 = sVar7;
        FormatBuffer::append(pFVar3,sVar7);
        std::__cxx11::string::~string((string *)&local_108);
      }
      pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_138,",");
      FormatBuffer::append(pFVar3,local_138[0]);
    }
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    FormatBuffer::pop_back(pFVar3);
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,")");
    FormatBuffer::append(pFVar3,local_148);
  }
  if (type->modport != (ModportSymbol *)0x0) {
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    sVar5 = std::char_traits<char>::length(".{}");
    local_158.size_ = sVar5;
    FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
              (pFVar3,(format_string<const_std::basic_string_view<char>_&>)local_158,
               &(type->modport->super_Symbol).name);
  }
  return;
}

Assistant:

void TypePrinter::visit(const VirtualInterfaceType& type, string_view) {
    buffer->append(type.iface.getDefinition().name);

    auto params = type.iface.body.parameters;
    if (!params.empty()) {
        buffer->append("#(");
        for (auto param : params) {
            buffer->format("{}=", param->symbol.name);
            if (param->symbol.kind == SymbolKind::TypeParameter)
                append(param->symbol.as<TypeParameterSymbol>().targetType.getType());
            else
                buffer->append(param->symbol.as<ParameterSymbol>().getValue().toString());
            buffer->append(",");
        }

        buffer->pop_back();
        buffer->append(")");
    }

    if (type.modport)
        buffer->format(".{}", type.modport->name);
}